

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int canrev(int x,int y,char (*board) [8],STATE s,int f)

{
  int iVar1;
  uint uVar2;
  int d;
  int i;
  long lVar3;
  uint uVar4;
  int iVar5;
  
  if (((uint)(y | x) < 8) && ((board[x][y] & 0xfeU) != 4)) {
    lVar3 = 0;
    do {
      uVar4 = dir[lVar3][0] + x;
      if (((uVar4 < 8) && (uVar2 = dir[lVar3][1] + y, uVar2 < 8)) &&
         ((s == WHITE | 4) == (int)board[uVar4][uVar2])) {
        iVar5 = 0;
        d = 0;
        do {
          iVar1 = revnum(x,y,d,board,s,f);
          iVar5 = iVar5 + iVar1;
          d = d + 1;
        } while (d != 8);
        return iVar5;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 8);
  }
  return 0;
}

Assistant:

int canrev(int x, int y, char board[][SIZE], STATE s, int f) {
    int i, sum = 0;
    if (board[x][y] == WHITE || board[x][y] == BLACK) {
        return 0;
    }
    if (x < 0 || x >= SIZE || y < 0 || y >= SIZE) {
        return 0;
    }
    STATE rs = (s == WHITE ? BLACK : WHITE);
    if (IsChessAround(x, y, board, rs)) {
        for (i = 0; i < 8; i++) {
            sum += revnum(x, y, i, board, s, f);
        }
    }
    return sum;
}